

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

string * __thiscall Lexer::trim(string *__return_storage_ptr__,Lexer *this,string *s)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  size_type sVar6;
  
  pcVar4 = (s->_M_dataplus)._M_p;
  sVar6 = s->_M_string_length;
  pcVar1 = pcVar4 + sVar6;
  while ((pcVar5 = pcVar1, sVar6 != 0 &&
         (iVar2 = isspace((int)*pcVar4), pcVar5 = pcVar4, iVar2 != 0))) {
    pcVar4 = pcVar4 + 1;
    sVar6 = sVar6 - 1;
  }
  pcVar4 = pcVar1 + ~(ulong)pcVar5;
  do {
    pcVar3 = pcVar1;
    if ((long)pcVar4 < 1) break;
    pcVar1 = pcVar3 + -1;
    iVar2 = isspace((int)*pcVar1);
    pcVar4 = pcVar4 + -1;
  } while (iVar2 != 0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)__return_storage_ptr__,pcVar5,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

string Lexer::trim(const std::string &s) {
  auto start = s.begin();
  while (start != s.end() && std::isspace(*start)) {
    start++;
  }
  auto end = s.end();
  do {
    end--;
  } while (std::distance(start, end) > 0 && std::isspace(*end));
  return std::string(start, end + 1);
}